

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t Crap8(uint8_t *key,uint32_t len,uint32_t seed)

{
  uint *puVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  
  uVar5 = seed + len;
  uVar4 = len + 0x97e1cc59;
  for (; 7 < len; len = len - 8) {
    uVar2 = *(uint *)key;
    puVar1 = (uint *)((long)key + 4);
    key = (uint8_t *)((long)key + 8);
    uVar4 = uVar4 ^ (uint)((ulong)uVar2 * 0x83d2e73b) ^ (uint)((ulong)*puVar1 * 0x83d2e73b);
    uVar5 = (uint)((ulong)*puVar1 * 0x83d2e73b >> 0x20) ^
            ((uint)((ulong)uVar2 * 0x83d2e73b >> 0x20) ^ uVar5 * -0x7c2d18c5) * -0x7c2d18c5;
  }
  if (3 < len) {
    uVar2 = *(uint *)key;
    key = (uint8_t *)((long)key + 4);
    len = len - 4;
    uVar4 = uVar4 ^ (uint)((ulong)uVar2 * 0x83d2e73b);
    uVar5 = (uint)((ulong)uVar2 * 0x83d2e73b >> 0x20) ^ uVar5 * -0x7c2d18c5;
  }
  if (len != 0) {
    bVar7 = (byte)(len << 3);
    sVar3 = (bVar7 < 0x21) * (' ' - bVar7);
    lVar6 = (ulong)((*(uint *)key << sVar3) >> sVar3) * 0x83d2e73b;
    uVar4 = uVar4 ^ (uint)lVar6;
    uVar5 = (uint)((ulong)lVar6 >> 0x20) ^ uVar5 * -0x7c2d18c5;
  }
  lVar6 = (ulong)(uVar5 ^ uVar4) * 0x97e1cc59;
  return (uint)lVar6 ^ uVar4 ^ (uint)((ulong)lVar6 >> 0x20);
}

Assistant:

uint32_t
Crap8(const uint8_t * key, uint32_t len, uint32_t seed)
{
#define c8fold( a, b, y, z ) { p = (uint32_t)(a) * (uint64_t)(b); y ^= (uint32_t)p; z ^= (uint32_t)(p >> 32); }
#define c8mix( in ) { h *= m; c8fold( in, m, k, h ); }

  const uint32_t  m = 0x83d2e73b, n = 0x97e1cc59, *key4 = (const uint32_t *)key;
  uint32_t	  h = len + seed, k = n + len;
  uint64_t	  p;

  while (len >= 8) {
    c8mix(key4[0]) c8mix(key4[1]) key4 += 2;
    len -= 8;
  }
  if (len >= 4) {
    c8mix(key4[0]) key4 += 1;
    len -= 4;
  }
  if (len) {
    c8mix(key4[0] & ((1 << (len * 8)) - 1))
  }
  c8fold(h ^ k, n, k, k)
  return k;
}